

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O3

void __thiscall
btCollisionWorld::btCollisionWorld
          (btCollisionWorld *this,btDispatcher *dispatcher,btBroadphaseInterface *pairCache,
          btCollisionConfiguration *collisionConfiguration)

{
  this->_vptr_btCollisionWorld = (_func_int **)&PTR__btCollisionWorld_0021b9e0;
  (this->m_collisionObjects).m_ownsMemory = true;
  (this->m_collisionObjects).m_data = (btCollisionObject **)0x0;
  (this->m_collisionObjects).m_size = 0;
  (this->m_collisionObjects).m_capacity = 0;
  this->m_dispatcher1 = dispatcher;
  (this->m_dispatchInfo).m_timeStep = 0.0;
  (this->m_dispatchInfo).m_stepCount = 0;
  (this->m_dispatchInfo).m_dispatchFunc = 1;
  (this->m_dispatchInfo).m_timeOfImpact = 1.0;
  (this->m_dispatchInfo).m_useContinuous = true;
  (this->m_dispatchInfo).m_debugDraw = (btIDebugDraw *)0x0;
  (this->m_dispatchInfo).m_enableSatConvex = false;
  (this->m_dispatchInfo).m_enableSPU = true;
  (this->m_dispatchInfo).m_useEpa = true;
  (this->m_dispatchInfo).m_allowedCcdPenetration = 0.04;
  (this->m_dispatchInfo).m_useConvexConservativeDistanceUtil = false;
  (this->m_dispatchInfo).m_convexConservativeDistanceThreshold = 0.0;
  this->m_broadphasePairCache = pairCache;
  this->m_debugDrawer = (btIDebugDraw *)0x0;
  this->m_forceUpdateAllAabbs = true;
  return;
}

Assistant:

btCollisionWorld::btCollisionWorld(btDispatcher* dispatcher,btBroadphaseInterface* pairCache, btCollisionConfiguration* collisionConfiguration)
:m_dispatcher1(dispatcher),
m_broadphasePairCache(pairCache),
m_debugDrawer(0),
m_forceUpdateAllAabbs(true)
{
}